

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O2

Bbr2Mode __thiscall
quic::Bbr2ProbeBwMode::OnExitQuiescence
          (Bbr2ProbeBwMode *this,QuicTime now,QuicTime quiescence_start_time)

{
  Bbr2NetworkModel::PostponeMinRttTimestamp
            ((this->super_Bbr2ModeBase).model_,(Delta)(now.time_ - quiescence_start_time.time_));
  return PROBE_BW;
}

Assistant:

Bbr2Mode Bbr2ProbeBwMode::OnExitQuiescence(QuicTime now,
                                           QuicTime quiescence_start_time) {
 /* QUIC_DVLOG(3) << sender_ << " Postponing min_rtt_timestamp("
                << model_->MinRttTimestamp() << ") by "
                << now - quiescence_start_time;*/
  model_->PostponeMinRttTimestamp(now - quiescence_start_time);
  return Bbr2Mode::PROBE_BW;
}